

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O1

_Bool fy_emit_token_write_block_hints
                (fy_emitter *emit,fy_token *fyt,int flags,int indent,char *chompp)

{
  bool bVar1;
  uint uVar2;
  fy_atom *pfVar3;
  int c;
  _Bool _Var4;
  byte bVar5;
  
  pfVar3 = fy_token_atom(fyt);
  if (pfVar3 == (fy_atom *)0x0) {
    *(byte *)&emit->flags = (byte)emit->flags & 0xfb;
    bVar5 = 0x2d;
    _Var4 = false;
  }
  else {
    if ((*(ushort *)&pfVar3->field_0x35 & 0x180) == 0) {
      _Var4 = false;
    }
    else {
      uVar2 = emit->cfg->flags >> 8 & 0xf;
      c = 0x32;
      if (uVar2 != 0) {
        c = uVar2 + 0x30;
      }
      fy_emit_putc(emit,fyewt_indicator,c);
      _Var4 = true;
    }
    if ((*(uint *)&pfVar3->field_0x34 >> 0x12 & 1) == 0) {
      *(byte *)&emit->flags = (byte)emit->flags & 0xfb;
      bVar5 = 0x2d;
    }
    else {
      if ((*(uint *)&pfVar3->field_0x34 >> 0x13 & 1) == 0) {
        emit->flags = emit->flags & 0xfffffffb;
        bVar1 = true;
        bVar5 = 0;
        goto LAB_00127f02;
      }
      emit->flags = emit->flags | 4;
      bVar5 = 0x2b;
    }
  }
  bVar1 = false;
LAB_00127f02:
  if (!bVar1) {
    fy_emit_putc(emit,fyewt_indicator,(uint)bVar5);
  }
  *chompp = bVar5;
  return _Var4;
}

Assistant:

bool
fy_emit_token_write_block_hints(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent, char *chompp) {
    char chomp = '\0';
    bool explicit_chomp = false;
    struct fy_atom *atom;

    atom = fy_token_atom(fyt);
    if (!atom) {
        emit->flags &= ~FYEF_OPEN_ENDED;
        chomp = '-';
        goto out;
    }

    if (atom->starts_with_ws || atom->starts_with_lb) {
        fy_emit_putc(emit, fyewt_indicator, '0' + fy_emit_indent(emit));
        explicit_chomp = true;
    }

    if (!atom->ends_with_lb) {
        emit->flags &= ~FYEF_OPEN_ENDED;
        chomp = '-';
        goto out;
    }

    if (atom->trailing_lb) {
        emit->flags |= FYEF_OPEN_ENDED;
        chomp = '+';
        goto out;
    }
    emit->flags &= ~FYEF_OPEN_ENDED;

    out:
    if (chomp)
        fy_emit_putc(emit, fyewt_indicator, chomp);
    *chompp = chomp;
    return explicit_chomp;
}